

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_serialize.c
# Opt level: O3

void lj_serialize_decode(lua_State *L,TValue *o,GCstr *str)

{
  char *pcVar1;
  SBufExt local_58;
  
  local_58.dict_str.gcptr64 = 0;
  local_58.dict_mt.gcptr64 = 0;
  local_58.field_4 = (anon_union_8_2_d9f1b0d6_for_SBufExt_4)0x0;
  local_58.b = (char *)(str + 1);
  local_58.L.ptr64 = (long)&(L->nextgc).gcptr64 + 3;
  local_58.w = (char *)((long)&str[1].nextgc.gcptr64 + (ulong)str->len);
  local_58.depth = 100;
  local_58._68_4_ = 0;
  local_58.e = local_58.w;
  local_58.r = local_58.b;
  pcVar1 = serialize_get(local_58.b,&local_58,o);
  if (pcVar1 == local_58.w) {
    return;
  }
  lj_err_caller(L,LJ_ERR_BUFFER_LEFTOV);
}

Assistant:

void lj_serialize_decode(lua_State *L, TValue *o, GCstr *str)
{
  SBufExt sbx;
  char *r;
  memset(&sbx, 0, sizeof(SBufExt));
  lj_bufx_set_cow(L, &sbx, strdata(str), str->len);
  /* No need to set sbx.cowref here. */
  sbx.depth = LJ_SERIALIZE_DEPTH;
  r = serialize_get(sbx.r, &sbx, o);
  if (r != sbx.w) lj_err_caller(L, LJ_ERR_BUFFER_LEFTOV);
}